

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O3

REF_STATUS
ref_face_open_node(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz3,REF_INT *open_node,
                  REF_DBL *dot)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  double dVar4;
  double local_68;
  double dStack_60;
  double local_58;
  double local_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_48 = *xyz0 - *xyz3;
  dStack_40 = xyz0[1] - xyz3[1];
  local_38 = xyz0[2] - xyz3[2];
  local_68 = *xyz1 - *xyz0;
  dStack_60 = xyz1[1] - xyz0[1];
  local_58 = xyz1[2] - xyz0[2];
  uVar1 = ref_math_normalize(&local_48);
  if (uVar1 == 0) {
    uVar1 = ref_math_normalize(&local_68);
    if (uVar1 == 0) {
      local_50 = local_58 * local_38 + local_68 * local_48 + dStack_60 * dStack_40;
      *open_node = 0;
      *dot = local_50;
      local_48 = *xyz1 - *xyz0;
      dStack_40 = xyz1[1] - xyz0[1];
      local_38 = xyz1[2] - xyz0[2];
      local_68 = *xyz2 - *xyz1;
      dStack_60 = xyz2[1] - xyz1[1];
      local_58 = xyz2[2] - xyz1[2];
      uVar1 = ref_math_normalize(&local_48);
      if (uVar1 == 0) {
        uVar1 = ref_math_normalize(&local_68);
        if (uVar1 == 0) {
          dVar4 = local_58 * local_38 + local_68 * local_48 + dStack_60 * dStack_40;
          if (local_50 < dVar4) {
            *open_node = 1;
            *dot = dVar4;
            local_50 = dVar4;
          }
          local_48 = *xyz2 - *xyz1;
          dStack_40 = xyz2[1] - xyz1[1];
          local_38 = xyz2[2] - xyz1[2];
          local_68 = *xyz3 - *xyz2;
          dStack_60 = xyz3[1] - xyz2[1];
          local_58 = xyz3[2] - xyz2[2];
          uVar1 = ref_math_normalize(&local_48);
          if (uVar1 == 0) {
            uVar1 = ref_math_normalize(&local_68);
            if (uVar1 == 0) {
              dVar4 = local_58 * local_38 + local_68 * local_48 + dStack_60 * dStack_40;
              if (local_50 < dVar4) {
                *open_node = 2;
                *dot = dVar4;
                local_50 = dVar4;
              }
              local_48 = *xyz3 - *xyz2;
              dStack_40 = xyz3[1] - xyz2[1];
              local_38 = xyz3[2] - xyz2[2];
              local_68 = *xyz0 - *xyz3;
              dStack_60 = xyz0[1] - xyz3[1];
              local_58 = xyz0[2] - xyz3[2];
              uVar1 = ref_math_normalize(&local_48);
              if (uVar1 == 0) {
                uVar1 = ref_math_normalize(&local_68);
                if (uVar1 == 0) {
                  dVar4 = local_58 * local_38 + local_68 * local_48 + dStack_60 * dStack_40;
                  if (dVar4 <= local_50) {
                    return 0;
                  }
                  *open_node = 3;
                  *dot = dVar4;
                  return 0;
                }
                pcVar3 = "e2";
                uVar2 = 0x132;
              }
              else {
                pcVar3 = "e1";
                uVar2 = 0x131;
              }
            }
            else {
              pcVar3 = "e2";
              uVar2 = 0x122;
            }
          }
          else {
            pcVar3 = "e1";
            uVar2 = 0x121;
          }
        }
        else {
          pcVar3 = "e2";
          uVar2 = 0x112;
        }
      }
      else {
        pcVar3 = "e1";
        uVar2 = 0x111;
      }
    }
    else {
      pcVar3 = "e2";
      uVar2 = 0x104;
    }
  }
  else {
    pcVar3 = "e1";
    uVar2 = 0x103;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",uVar2,
         "ref_face_open_node",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_face_open_node(REF_DBL *xyz0, REF_DBL *xyz1,
                                      REF_DBL *xyz2, REF_DBL *xyz3,
                                      REF_INT *open_node, REF_DBL *dot) {
  REF_DBL edge1[3], edge2[3];
  REF_DBL open_dot;

  edge1[0] = xyz0[0] - xyz3[0];
  edge1[1] = xyz0[1] - xyz3[1];
  edge1[2] = xyz0[2] - xyz3[2];

  edge2[0] = xyz1[0] - xyz0[0];
  edge2[1] = xyz1[1] - xyz0[1];
  edge2[2] = xyz1[2] - xyz0[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  open_dot = ref_math_dot(edge2, edge1);
  *open_node = 0;
  *dot = open_dot;

  edge1[0] = xyz1[0] - xyz0[0];
  edge1[1] = xyz1[1] - xyz0[1];
  edge1[2] = xyz1[2] - xyz0[2];

  edge2[0] = xyz2[0] - xyz1[0];
  edge2[1] = xyz2[1] - xyz1[1];
  edge2[2] = xyz2[2] - xyz1[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  if (ref_math_dot(edge2, edge1) > open_dot) {
    open_dot = ref_math_dot(edge2, edge1);
    *open_node = 1;
    *dot = open_dot;
  }

  edge1[0] = xyz2[0] - xyz1[0];
  edge1[1] = xyz2[1] - xyz1[1];
  edge1[2] = xyz2[2] - xyz1[2];

  edge2[0] = xyz3[0] - xyz2[0];
  edge2[1] = xyz3[1] - xyz2[1];
  edge2[2] = xyz3[2] - xyz2[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  if (ref_math_dot(edge2, edge1) > open_dot) {
    open_dot = ref_math_dot(edge2, edge1);
    *open_node = 2;
    *dot = open_dot;
  }

  edge1[0] = xyz3[0] - xyz2[0];
  edge1[1] = xyz3[1] - xyz2[1];
  edge1[2] = xyz3[2] - xyz2[2];

  edge2[0] = xyz0[0] - xyz3[0];
  edge2[1] = xyz0[1] - xyz3[1];
  edge2[2] = xyz0[2] - xyz3[2];

  RSS(ref_math_normalize(edge1), "e1");
  RSS(ref_math_normalize(edge2), "e2");
  if (ref_math_dot(edge2, edge1) > open_dot) {
    open_dot = ref_math_dot(edge2, edge1);
    *open_node = 3;
    *dot = open_dot;
  }

  return REF_SUCCESS;
}